

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::arrayStr<float,5>
          (string *__return_storage_ptr__,Functional *this,float (*arr) [5])

{
  char *pcVar1;
  long lVar2;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"{ ",(allocator<char> *)&local_50);
  for (lVar2 = 0; lVar2 != 0x14; lVar2 = lVar2 + 4) {
    de::toString<float>(&local_70,(float *)(this + lVar2));
    pcVar1 = " , ";
    if (lVar2 == 0) {
      pcVar1 = glcts::fixed_sample_locations_values;
    }
    std::operator+(&local_50,(bool *)pcVar1 + 1,&local_70);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static string arrayStr (const T (&arr)[Size])
{
	string result = "{ ";
	for (int i = 0; i < Size; i++)
		result += (i > 0 ? ", " : "") + toString(arr[i]);
	result += " }";
	return result;
}